

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_lite_unittest.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::TestEnumMapLite::~TestEnumMapLite(TestEnumMapLite *this)

{
  TestEnumMapLite *this_local;
  
  ~TestEnumMapLite(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TestEnumMapLite::~TestEnumMapLite() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestEnumMapLite)
  SharedDtor(*this);
}